

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O1

AltNode * __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::AppendSurrogateRangeToDisjunction
          (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this,codepoint_t minorCodePoint,
          codepoint_t majorCodePoint,AltNode *lastAltNode)

{
  undefined1 *puVar1;
  code *pcVar2;
  Node *pNVar3;
  codepoint_t cVar4;
  bool bVar5;
  undefined4 *puVar6;
  _func_int **pp_Var7;
  undefined8 *puVar8;
  Node *pNVar9;
  undefined8 *puVar10;
  AltNode *pAVar11;
  AltNode *pAVar12;
  long lVar13;
  codepoint_t codePointValue;
  uint uVar14;
  uint codePointValue_00;
  Parser<NullTerminatedUnicodeEncodingPolicy,_true> *pPVar15;
  uint uVar16;
  Char local_7a;
  AltNode *pAStack_78;
  char16 lowerMajorBoundary;
  Node *local_70;
  char16 local_66;
  uint local_64;
  uint uStack_60;
  char16 ignore;
  undefined4 uStack_5c;
  Char local_56;
  codepoint_t local_54;
  uint uStack_50;
  char16 lowerMinorBoundary;
  undefined4 uStack_4c;
  char16 local_46;
  char16 local_44;
  Char local_42;
  char16 upperMinorCodeUnit;
  char16 lowerMajorCodeUnit;
  Parser<NullTerminatedUnicodeEncodingPolicy,_true> *pPStack_40;
  char16 upperMajorCodeUnit;
  char16 local_32 [4];
  char16 lowerMinorCodeUnit;
  
  uVar14 = majorCodePoint - minorCodePoint;
  _uStack_50 = (AltNode *)CONCAT44(uStack_4c,minorCodePoint);
  if (majorCodePoint < minorCodePoint || uVar14 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x194,"(minorCodePoint < majorCodePoint)","minorCodePoint < majorCodePoint")
    ;
    if (!bVar5) goto LAB_00ec7724;
    *puVar6 = 0;
    minorCodePoint = uStack_50;
  }
  if (minorCodePoint < 0x10000) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x195,"(minorCodePoint >= 0x10000u)","minorCodePoint >= 0x10000u");
    if (!bVar5) goto LAB_00ec7724;
    *puVar6 = 0;
    minorCodePoint = uStack_50;
  }
  if (majorCodePoint < 0x10000) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x196,"(majorCodePoint >= 0x10000u)","majorCodePoint >= 0x10000u");
    if (!bVar5) goto LAB_00ec7724;
    *puVar6 = 0;
    minorCodePoint = uStack_50;
  }
  if ((((this->scriptContext->config).threadConfig)->m_ES6Unicode != true) ||
     (this->unicodeFlagPresent == false)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x197,
                       "(scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled() && unicodeFlagPresent)"
                       ,
                       "scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled() && unicodeFlagPresent"
                      );
    if (!bVar5) goto LAB_00ec7724;
    *puVar6 = 0;
    minorCodePoint = uStack_50;
  }
  local_64 = uVar14;
  Js::NumberUtilities::CodePointAsSurrogatePair(minorCodePoint,local_32,&local_46);
  local_54 = majorCodePoint;
  Js::NumberUtilities::CodePointAsSurrogatePair(majorCodePoint,&local_44,&local_42);
  codePointValue_00 = minorCodePoint & 0xfffffc00;
  uVar14 = codePointValue_00 + 0x400;
  _uStack_60 = (Node *)CONCAT44(uStack_5c,uVar14);
  if (uVar14 < 0x10000) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x1a3,"(minorBoundary >= 0x10000)","minorBoundary >= 0x10000");
    if (!bVar5) goto LAB_00ec7724;
    *puVar6 = 0;
    uVar14 = uStack_60;
    minorCodePoint = uStack_50;
  }
  if (local_54 < 0x10000) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x1a4,"(majorBoundary >= 0x10000)","majorBoundary >= 0x10000");
    if (!bVar5) goto LAB_00ec7724;
    *puVar6 = 0;
    minorCodePoint = uStack_50;
    uVar14 = uStack_60;
  }
  uVar16 = local_54 & 0xfffffc00;
  pAStack_78 = lastAltNode;
  if (uVar16 < uVar14) {
    if (0x3ff < local_64) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x1ae,"(majorCodePoint - minorCodePoint < 0x400u)",
                         "majorCodePoint - minorCodePoint < 0x400u");
      if (!bVar5) goto LAB_00ec7724;
      *puVar6 = 0;
    }
    if (local_32[0] != local_44) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x1af,"(lowerMinorCodeUnit == lowerMajorCodeUnit)",
                         "lowerMinorCodeUnit == lowerMajorCodeUnit");
      if (!bVar5) goto LAB_00ec7724;
      *puVar6 = 0;
    }
    pp_Var7 = (_func_int **)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x366bee);
    *(undefined4 *)(pp_Var7 + 1) = 5;
    *(uint *)((long)pp_Var7 + 0xc) = *(uint *)((long)pp_Var7 + 0xc) & 0xffff8000;
    pp_Var7[2] = (_func_int *)0x0;
    pp_Var7[3] = (_func_int *)0x0;
    *(undefined4 *)(pp_Var7 + 4) = 0;
    *(undefined8 *)((long)pp_Var7 + 0x24) = 0xffffffff;
    *(undefined8 *)((long)pp_Var7 + 0x2c) = 0xffffffff;
    *(undefined4 *)((long)pp_Var7 + 0x34) = 0xffffffff;
    *pp_Var7 = (_func_int *)&PTR_LiteralLength_01558ef0;
    *(undefined1 *)(pp_Var7 + 8) = 0;
    *(char16 *)(pp_Var7 + 7) = local_32[0];
    lVar13 = 0x1d;
    do {
      *(char16 *)((long)pp_Var7 + lVar13 * 2) = local_32[0];
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0x20);
    puVar8 = (undefined8 *)new<Memory::ArenaAllocator>(0x68,this->ctAllocator,0x366bee);
    *(undefined4 *)(puVar8 + 1) = 0xb;
    *(uint *)((long)puVar8 + 0xc) = *(uint *)((long)puVar8 + 0xc) & 0xffff8000;
    puVar8[2] = 0;
    puVar8[3] = 0;
    *(undefined4 *)(puVar8 + 4) = 0;
    *(undefined8 *)((long)puVar8 + 0x24) = 0xffffffff;
    *(undefined8 *)((long)puVar8 + 0x2c) = 0xffffffff;
    *(undefined4 *)((long)puVar8 + 0x34) = 0xffffffff;
    *puVar8 = &PTR_LiteralLength_01558fd0;
    *(undefined2 *)(puVar8 + 7) = 0x100;
    CharSet<char16_t>::CharSet((CharSet<char16_t> *)(puVar8 + 8));
    CharSet<char16_t>::SetRange
              ((CharSet<char16_t> *)(puVar8 + 8),this->ctAllocator,local_46,local_42);
    pNVar9 = (Node *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x366bee);
    puVar10 = (undefined8 *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x366bee);
    *(undefined4 *)(puVar10 + 1) = 6;
    *(uint *)((long)puVar10 + 0xc) = *(uint *)((long)puVar10 + 0xc) & 0xffff8000;
    puVar10[2] = 0;
    puVar10[3] = 0;
    *(undefined4 *)(puVar10 + 4) = 0;
    *(undefined8 *)((long)puVar10 + 0x24) = 0xffffffff;
    *(undefined8 *)((long)puVar10 + 0x2c) = 0xffffffff;
    *(undefined4 *)((long)puVar10 + 0x34) = 0xffffffff;
    *puVar10 = &PTR_LiteralLength_015590b0;
    puVar10[7] = puVar8;
    puVar10[8] = 0;
    pNVar9->tag = Concat;
    pNVar9->features = 0;
    *(uint *)&pNVar9->field_0xc = *(uint *)&pNVar9->field_0xc & 0xffff8000;
    pNVar9->firstSet = (CharSet<char16_t> *)0x0;
    pNVar9->followSet = (CharSet<char16_t> *)0x0;
    (pNVar9->prevConsumes).lower = 0;
    *(undefined8 *)&(pNVar9->prevConsumes).upper = 0xffffffff;
    *(undefined8 *)&(pNVar9->thisConsumes).upper = 0xffffffff;
    (pNVar9->followConsumes).upper = 0xffffffff;
    pNVar9->_vptr_Node = (_func_int **)&PTR_LiteralLength_015590b0;
    pNVar9[1]._vptr_Node = pp_Var7;
    *(undefined8 **)&pNVar9[1].tag = puVar10;
    pAVar11 = (AltNode *)new<Memory::ArenaAllocator>(0x60,this->ctAllocator,0x366bee);
    (pAVar11->super_Node).tag = Alt;
    (pAVar11->super_Node).features = 0;
    puVar1 = &(pAVar11->super_Node).field_0xc;
    *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
    (pAVar11->super_Node).firstSet = (CharSet<char16_t> *)0x0;
    (pAVar11->super_Node).followSet = (CharSet<char16_t> *)0x0;
    (pAVar11->super_Node).prevConsumes.lower = 0;
    *(undefined8 *)&(pAVar11->super_Node).prevConsumes.upper = 0xffffffff;
    *(undefined8 *)&(pAVar11->super_Node).thisConsumes.upper = 0xffffffff;
    (pAVar11->super_Node).followConsumes.upper = 0xffffffff;
    (pAVar11->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01559190;
    pAVar11->head = pNVar9;
    pAVar11->switchSize = 0;
    pAVar11->tail = (AltNode *)0x0;
    pAVar11->runtimeTrie = (RuntimeCharTrie *)0x0;
    *(undefined8 *)((long)&pAVar11->runtimeTrie + 5) = 0;
    lastAltNode = pAStack_78;
  }
  else {
    pPStack_40 = this;
    if (uVar14 - minorCodePoint == 1) {
      local_70 = CreateSurrogatePairAtom(this,local_32[0],local_46);
      codePointValue_00 = uStack_60;
      uVar14 = uStack_60;
    }
    else if (codePointValue_00 == minorCodePoint) {
      local_70 = (Node *)0x0;
    }
    else {
      if (0x3ff < uVar14 - minorCodePoint) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x1c5,"(minorBoundary - minorCodePoint < 0x400u)",
                           "minorBoundary - minorCodePoint < 0x400u");
        if (!bVar5) goto LAB_00ec7724;
        *puVar6 = 0;
      }
      pp_Var7 = (_func_int **)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x366bee);
      *(undefined4 *)(pp_Var7 + 1) = 5;
      *(uint *)((long)pp_Var7 + 0xc) = *(uint *)((long)pp_Var7 + 0xc) & 0xffff8000;
      pp_Var7[2] = (_func_int *)0x0;
      pp_Var7[3] = (_func_int *)0x0;
      *(undefined4 *)(pp_Var7 + 4) = 0;
      *(undefined8 *)((long)pp_Var7 + 0x24) = 0xffffffff;
      *(undefined8 *)((long)pp_Var7 + 0x2c) = 0xffffffff;
      *(undefined4 *)((long)pp_Var7 + 0x34) = 0xffffffff;
      *pp_Var7 = (_func_int *)&PTR_LiteralLength_01558ef0;
      *(undefined1 *)(pp_Var7 + 8) = 0;
      *(char16 *)(pp_Var7 + 7) = local_32[0];
      lVar13 = 0x1d;
      do {
        *(char16 *)((long)pp_Var7 + lVar13 * 2) = local_32[0];
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x20);
      puVar8 = (undefined8 *)new<Memory::ArenaAllocator>(0x68,this->ctAllocator,0x366bee);
      *(undefined4 *)(puVar8 + 1) = 0xb;
      *(uint *)((long)puVar8 + 0xc) = *(uint *)((long)puVar8 + 0xc) & 0xffff8000;
      puVar8[2] = 0;
      puVar8[3] = 0;
      *(undefined4 *)(puVar8 + 4) = 0;
      *(undefined8 *)((long)puVar8 + 0x24) = 0xffffffff;
      *(undefined8 *)((long)puVar8 + 0x2c) = 0xffffffff;
      *(undefined4 *)((long)puVar8 + 0x34) = 0xffffffff;
      *puVar8 = &PTR_LiteralLength_01558fd0;
      *(undefined2 *)(puVar8 + 7) = 0x100;
      CharSet<char16_t>::CharSet((CharSet<char16_t> *)(puVar8 + 8));
      this = pPStack_40;
      CharSet<char16_t>::SetRange
                ((CharSet<char16_t> *)(puVar8 + 8),pPStack_40->ctAllocator,local_46,L'\xdfff');
      pNVar9 = (Node *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x366bee);
      puVar10 = (undefined8 *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x366bee);
      *(undefined4 *)(puVar10 + 1) = 6;
      *(uint *)((long)puVar10 + 0xc) = *(uint *)((long)puVar10 + 0xc) & 0xffff8000;
      puVar10[2] = 0;
      puVar10[3] = 0;
      *(undefined4 *)(puVar10 + 4) = 0;
      *(undefined8 *)((long)puVar10 + 0x24) = 0xffffffff;
      *(undefined8 *)((long)puVar10 + 0x2c) = 0xffffffff;
      *(undefined4 *)((long)puVar10 + 0x34) = 0xffffffff;
      *puVar10 = &PTR_LiteralLength_015590b0;
      puVar10[7] = puVar8;
      puVar10[8] = 0;
      pNVar9->tag = Concat;
      pNVar9->features = 0;
      *(uint *)&pNVar9->field_0xc = *(uint *)&pNVar9->field_0xc & 0xffff8000;
      pNVar9->firstSet = (CharSet<char16_t> *)0x0;
      pNVar9->followSet = (CharSet<char16_t> *)0x0;
      (pNVar9->prevConsumes).lower = 0;
      *(undefined8 *)&(pNVar9->prevConsumes).upper = 0xffffffff;
      *(undefined8 *)&(pNVar9->thisConsumes).upper = 0xffffffff;
      (pNVar9->followConsumes).upper = 0xffffffff;
      pNVar9->_vptr_Node = (_func_int **)&PTR_LiteralLength_015590b0;
      pNVar9[1]._vptr_Node = pp_Var7;
      *(undefined8 **)&pNVar9[1].tag = puVar10;
      lastAltNode = pAStack_78;
      codePointValue_00 = uStack_60;
      uVar14 = uStack_60;
      local_70 = pNVar9;
    }
    if (uVar16 == local_54) {
      pNVar9 = CreateSurrogatePairAtom(this,local_44,local_42);
      codePointValue = uVar16 - 0x400;
    }
    else if ((local_54 & 0x3ff) == 0x3ff) {
      pNVar9 = (Node *)0x0;
      uStack_60 = uVar14;
      codePointValue = uVar16;
    }
    else {
      pp_Var7 = (_func_int **)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x366bee);
      *(undefined4 *)(pp_Var7 + 1) = 5;
      *(uint *)((long)pp_Var7 + 0xc) = *(uint *)((long)pp_Var7 + 0xc) & 0xffff8000;
      pp_Var7[2] = (_func_int *)0x0;
      pp_Var7[3] = (_func_int *)0x0;
      *(undefined4 *)(pp_Var7 + 4) = 0;
      *(undefined8 *)((long)pp_Var7 + 0x24) = 0xffffffff;
      *(undefined8 *)((long)pp_Var7 + 0x2c) = 0xffffffff;
      *(undefined4 *)((long)pp_Var7 + 0x34) = 0xffffffff;
      *pp_Var7 = (_func_int *)&PTR_LiteralLength_01558ef0;
      *(undefined1 *)(pp_Var7 + 8) = 0;
      *(char16 *)(pp_Var7 + 7) = local_44;
      lVar13 = 0x1d;
      do {
        *(char16 *)((long)pp_Var7 + lVar13 * 2) = local_44;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x20);
      puVar8 = (undefined8 *)new<Memory::ArenaAllocator>(0x68,this->ctAllocator,0x366bee);
      *(undefined4 *)(puVar8 + 1) = 0xb;
      *(uint *)((long)puVar8 + 0xc) = *(uint *)((long)puVar8 + 0xc) & 0xffff8000;
      puVar8[2] = 0;
      puVar8[3] = 0;
      *(undefined4 *)(puVar8 + 4) = 0;
      *(undefined8 *)((long)puVar8 + 0x24) = 0xffffffff;
      *(undefined8 *)((long)puVar8 + 0x2c) = 0xffffffff;
      *(undefined4 *)((long)puVar8 + 0x34) = 0xffffffff;
      *puVar8 = &PTR_LiteralLength_01558fd0;
      *(undefined2 *)(puVar8 + 7) = 0x100;
      CharSet<char16_t>::CharSet((CharSet<char16_t> *)(puVar8 + 8));
      CharSet<char16_t>::SetRange
                ((CharSet<char16_t> *)(puVar8 + 8),pPStack_40->ctAllocator,L'\xdc00',local_42);
      pNVar9 = (Node *)new<Memory::ArenaAllocator>(0x48,pPStack_40->ctAllocator,0x366bee);
      puVar10 = (undefined8 *)new<Memory::ArenaAllocator>(0x48,pPStack_40->ctAllocator,0x366bee);
      *(undefined4 *)(puVar10 + 1) = 6;
      *(uint *)((long)puVar10 + 0xc) = *(uint *)((long)puVar10 + 0xc) & 0xffff8000;
      puVar10[2] = 0;
      puVar10[3] = 0;
      *(undefined4 *)(puVar10 + 4) = 0;
      *(undefined8 *)((long)puVar10 + 0x24) = 0xffffffff;
      *(undefined8 *)((long)puVar10 + 0x2c) = 0xffffffff;
      *(undefined4 *)((long)puVar10 + 0x34) = 0xffffffff;
      *puVar10 = &PTR_LiteralLength_015590b0;
      puVar10[7] = puVar8;
      puVar10[8] = 0;
      pNVar9->tag = Concat;
      pNVar9->features = 0;
      *(uint *)&pNVar9->field_0xc = *(uint *)&pNVar9->field_0xc & 0xffff8000;
      pNVar9->firstSet = (CharSet<char16_t> *)0x0;
      pNVar9->followSet = (CharSet<char16_t> *)0x0;
      (pNVar9->prevConsumes).lower = 0;
      *(undefined8 *)&(pNVar9->prevConsumes).upper = 0xffffffff;
      *(undefined8 *)&(pNVar9->thisConsumes).upper = 0xffffffff;
      (pNVar9->followConsumes).upper = 0xffffffff;
      pNVar9->_vptr_Node = (_func_int **)&PTR_LiteralLength_015590b0;
      pNVar9[1]._vptr_Node = pp_Var7;
      *(undefined8 **)&pNVar9[1].tag = puVar10;
      codePointValue = uVar16 - 0x400;
      lastAltNode = pAStack_78;
      this = pPStack_40;
    }
    cVar4 = local_54;
    uVar14 = local_64;
    pNVar3 = local_70;
    _uStack_60 = pNVar9;
    if (((uStack_60 == uVar16) && (local_70 != (Node *)0x0)) && (pNVar9 != (Node *)0x0)) {
      if (codePointValue_00 - 0x400 == uStack_50) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x1e4,"(minorCodePoint != minorBoundary - 0x400u)",
                           "minorCodePoint != minorBoundary - 0x400u");
        if (!bVar5) goto LAB_00ec7724;
        *puVar6 = 0;
        this = pPStack_40;
      }
      if (codePointValue + 0x3ff == cVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x1e5,"(majorBoundary + 0x3FFu != majorCodePoint)",
                           "majorBoundary + 0x3FFu != majorCodePoint");
        if (!bVar5) goto LAB_00ec7724;
        *puVar6 = 0;
      }
      if (0x7ff < uVar14) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x1e9,"(majorCodePoint - minorCodePoint < 0x800u)",
                           "majorCodePoint - minorCodePoint < 0x800u");
        if (!bVar5) goto LAB_00ec7724;
        *puVar6 = 0;
      }
      pAVar11 = (AltNode *)new<Memory::ArenaAllocator>(0x60,this->ctAllocator,0x366bee);
      pAVar12 = (AltNode *)new<Memory::ArenaAllocator>(0x60,this->ctAllocator,0x366bee);
      (pAVar12->super_Node).tag = Alt;
      (pAVar12->super_Node).features = 0;
      puVar1 = &(pAVar12->super_Node).field_0xc;
      *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
      (pAVar12->super_Node).firstSet = (CharSet<char16_t> *)0x0;
      (pAVar12->super_Node).followSet = (CharSet<char16_t> *)0x0;
      (pAVar12->super_Node).prevConsumes.lower = 0;
      *(undefined8 *)&(pAVar12->super_Node).prevConsumes.upper = 0xffffffff;
      *(undefined8 *)&(pAVar12->super_Node).thisConsumes.upper = 0xffffffff;
      (pAVar12->super_Node).followConsumes.upper = 0xffffffff;
      (pAVar12->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01559190;
      pAVar12->head = _uStack_60;
      pAVar12->switchSize = 0;
      pAVar12->tail = (AltNode *)0x0;
      pAVar12->runtimeTrie = (RuntimeCharTrie *)0x0;
      *(undefined8 *)((long)&pAVar12->runtimeTrie + 5) = 0;
      (pAVar11->super_Node).tag = Alt;
      (pAVar11->super_Node).features = 0;
      puVar1 = &(pAVar11->super_Node).field_0xc;
      *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
      (pAVar11->super_Node).firstSet = (CharSet<char16_t> *)0x0;
      (pAVar11->super_Node).followSet = (CharSet<char16_t> *)0x0;
      (pAVar11->super_Node).prevConsumes.lower = 0;
      *(undefined8 *)&(pAVar11->super_Node).prevConsumes.upper = 0xffffffff;
      *(undefined8 *)&(pAVar11->super_Node).thisConsumes.upper = 0xffffffff;
      (pAVar11->super_Node).followConsumes.upper = 0xffffffff;
      (pAVar11->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01559190;
      pAVar11->head = local_70;
      pAVar11->tail = pAVar12;
      pAVar11->runtimeTrie = (RuntimeCharTrie *)0x0;
      pAVar11->scheme = Try;
      pAVar11->isOptional = false;
      pAVar11->switchSize = 0;
    }
    else {
      if (local_64 < 0x400) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x1ef,"(majorCodePoint - minorCodePoint >= 0x400u)",
                           "majorCodePoint - minorCodePoint >= 0x400u");
        if (!bVar5) goto LAB_00ec7724;
        *puVar6 = 0;
        this = pPStack_40;
      }
      if (((pNVar3 == (Node *)0x0) || (_uStack_60 == (Node *)0x0)) &&
         ((pNVar3 != (Node *)0x0 || codePointValue_00 != uStack_50 &&
          (_uStack_60 != (Node *)0x0 || codePointValue + 0x3ff != local_54)))) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x1f2,
                           "((prefixNode != nullptr && suffixNode != nullptr) || (prefixNode == nullptr && minorBoundary == minorCodePoint) || (suffixNode == nullptr && majorBoundary + 0x3FFu == majorCodePoint))"
                           ,
                           "(prefixNode != nullptr && suffixNode != nullptr) || (prefixNode == nullptr && minorBoundary == minorCodePoint) || (suffixNode == nullptr && majorBoundary + 0x3FFu == majorCodePoint)"
                          );
        if (!bVar5) goto LAB_00ec7724;
        *puVar6 = 0;
        this = pPStack_40;
      }
      Js::NumberUtilities::CodePointAsSurrogatePair(codePointValue_00,&local_56,&local_66);
      if (codePointValue == codePointValue_00) {
        pp_Var7 = (_func_int **)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x366bee);
        *(undefined4 *)(pp_Var7 + 1) = 5;
        *(uint *)((long)pp_Var7 + 0xc) = *(uint *)((long)pp_Var7 + 0xc) & 0xffff8000;
        pp_Var7[2] = (_func_int *)0x0;
        pp_Var7[3] = (_func_int *)0x0;
        *(undefined4 *)(pp_Var7 + 4) = 0;
        *(undefined8 *)((long)pp_Var7 + 0x24) = 0xffffffff;
        *(undefined8 *)((long)pp_Var7 + 0x2c) = 0xffffffff;
        *(undefined4 *)((long)pp_Var7 + 0x34) = 0xffffffff;
        *pp_Var7 = (_func_int *)&PTR_LiteralLength_01558ef0;
        *(undefined1 *)(pp_Var7 + 8) = 0;
        *(Char *)(pp_Var7 + 7) = local_56;
        lVar13 = 0x1d;
        do {
          *(Char *)((long)pp_Var7 + lVar13 * 2) = local_56;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 0x20);
      }
      else {
        Js::NumberUtilities::CodePointAsSurrogatePair(codePointValue,&local_7a,&local_66);
        pp_Var7 = (_func_int **)new<Memory::ArenaAllocator>(0x68,pPStack_40->ctAllocator,0x366bee);
        *(undefined4 *)(pp_Var7 + 1) = 0xb;
        *(uint *)((long)pp_Var7 + 0xc) = *(uint *)((long)pp_Var7 + 0xc) & 0xffff8000;
        pp_Var7[2] = (_func_int *)0x0;
        pp_Var7[3] = (_func_int *)0x0;
        *(undefined4 *)(pp_Var7 + 4) = 0;
        *(undefined8 *)((long)pp_Var7 + 0x24) = 0xffffffff;
        *(undefined8 *)((long)pp_Var7 + 0x2c) = 0xffffffff;
        *(undefined4 *)((long)pp_Var7 + 0x34) = 0xffffffff;
        *pp_Var7 = (_func_int *)&PTR_LiteralLength_01558fd0;
        *(undefined2 *)(pp_Var7 + 7) = 0x100;
        CharSet<char16_t>::CharSet((CharSet<char16_t> *)(pp_Var7 + 8));
        this = pPStack_40;
        CharSet<char16_t>::SetRange
                  ((CharSet<char16_t> *)(pp_Var7 + 8),pPStack_40->ctAllocator,local_56,local_7a);
      }
      pAVar11 = (AltNode *)0x0;
      puVar8 = (undefined8 *)new<Memory::ArenaAllocator>(0x68,this->ctAllocator,0x366bee);
      *(undefined4 *)(puVar8 + 1) = 0xb;
      *(uint *)((long)puVar8 + 0xc) = *(uint *)((long)puVar8 + 0xc) & 0xffff8000;
      puVar8[2] = 0;
      puVar8[3] = 0;
      *(undefined4 *)(puVar8 + 4) = 0;
      *(undefined8 *)((long)puVar8 + 0x24) = 0xffffffff;
      *(undefined8 *)((long)puVar8 + 0x2c) = 0xffffffff;
      *(undefined4 *)((long)puVar8 + 0x34) = 0xffffffff;
      *puVar8 = &PTR_LiteralLength_01558fd0;
      *(undefined2 *)(puVar8 + 7) = 0x100;
      CharSet<char16_t>::CharSet((CharSet<char16_t> *)(puVar8 + 8));
      pPVar15 = pPStack_40;
      CharSet<char16_t>::SetRange
                ((CharSet<char16_t> *)(puVar8 + 8),pPStack_40->ctAllocator,L'\xdc00',L'\xdfff');
      pNVar9 = _uStack_60;
      if (_uStack_60 != (Node *)0x0) {
        pAVar11 = (AltNode *)new<Memory::ArenaAllocator>(0x60,pPVar15->ctAllocator,0x366bee);
        (pAVar11->super_Node).tag = Alt;
        (pAVar11->super_Node).features = 0;
        puVar1 = &(pAVar11->super_Node).field_0xc;
        *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
        (pAVar11->super_Node).firstSet = (CharSet<char16_t> *)0x0;
        (pAVar11->super_Node).followSet = (CharSet<char16_t> *)0x0;
        (pAVar11->super_Node).prevConsumes.lower = 0;
        *(undefined8 *)&(pAVar11->super_Node).prevConsumes.upper = 0xffffffff;
        *(undefined8 *)&(pAVar11->super_Node).thisConsumes.upper = 0xffffffff;
        (pAVar11->super_Node).followConsumes.upper = 0xffffffff;
        (pAVar11->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01559190;
        pAVar11->head = pNVar9;
        pAVar11->switchSize = 0;
        pAVar11->tail = (AltNode *)0x0;
        pAVar11->runtimeTrie = (RuntimeCharTrie *)0x0;
        *(undefined8 *)((long)&pAVar11->runtimeTrie + 5) = 0;
      }
      pNVar9 = local_70;
      if (local_70 != (Node *)0x0) {
        pAVar12 = (AltNode *)new<Memory::ArenaAllocator>(0x60,pPVar15->ctAllocator,0x366bee);
        (pAVar12->super_Node).tag = Alt;
        (pAVar12->super_Node).features = 0;
        puVar1 = &(pAVar12->super_Node).field_0xc;
        *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
        (pAVar12->super_Node).firstSet = (CharSet<char16_t> *)0x0;
        (pAVar12->super_Node).followSet = (CharSet<char16_t> *)0x0;
        (pAVar12->super_Node).prevConsumes.lower = 0;
        *(undefined8 *)&(pAVar12->super_Node).prevConsumes.upper = 0xffffffff;
        *(undefined8 *)&(pAVar12->super_Node).thisConsumes.upper = 0xffffffff;
        (pAVar12->super_Node).followConsumes.upper = 0xffffffff;
        (pAVar12->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01559190;
        pAVar12->head = pNVar9;
        pAVar12->tail = pAVar11;
        pAVar12->runtimeTrie = (RuntimeCharTrie *)0x0;
        pAVar12->scheme = Try;
        pAVar12->isOptional = false;
        pAVar12->switchSize = 0;
        pPVar15 = pPStack_40;
        pAVar11 = pAVar12;
      }
      _uStack_50 = pAVar11;
      pAVar11 = (AltNode *)new<Memory::ArenaAllocator>(0x60,pPVar15->ctAllocator,0x366bee);
      pNVar9 = (Node *)new<Memory::ArenaAllocator>(0x48,pPVar15->ctAllocator,0x366bee);
      puVar10 = (undefined8 *)new<Memory::ArenaAllocator>(0x48,pPVar15->ctAllocator,0x366bee);
      *(undefined4 *)(puVar10 + 1) = 6;
      *(uint *)((long)puVar10 + 0xc) = *(uint *)((long)puVar10 + 0xc) & 0xffff8000;
      puVar10[2] = 0;
      puVar10[3] = 0;
      *(undefined4 *)(puVar10 + 4) = 0;
      *(undefined8 *)((long)puVar10 + 0x24) = 0xffffffff;
      *(undefined8 *)((long)puVar10 + 0x2c) = 0xffffffff;
      *(undefined4 *)((long)puVar10 + 0x34) = 0xffffffff;
      *puVar10 = &PTR_LiteralLength_015590b0;
      puVar10[7] = puVar8;
      puVar10[8] = 0;
      pNVar9->tag = Concat;
      pNVar9->features = 0;
      *(uint *)&pNVar9->field_0xc = *(uint *)&pNVar9->field_0xc & 0xffff8000;
      pNVar9->firstSet = (CharSet<char16_t> *)0x0;
      pNVar9->followSet = (CharSet<char16_t> *)0x0;
      (pNVar9->prevConsumes).lower = 0;
      *(undefined8 *)&(pNVar9->prevConsumes).upper = 0xffffffff;
      *(undefined8 *)&(pNVar9->thisConsumes).upper = 0xffffffff;
      (pNVar9->followConsumes).upper = 0xffffffff;
      pNVar9->_vptr_Node = (_func_int **)&PTR_LiteralLength_015590b0;
      pNVar9[1]._vptr_Node = pp_Var7;
      *(undefined8 **)&pNVar9[1].tag = puVar10;
      (pAVar11->super_Node).tag = Alt;
      (pAVar11->super_Node).features = 0;
      puVar1 = &(pAVar11->super_Node).field_0xc;
      *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
      (pAVar11->super_Node).prevConsumes.lower = 0;
      (pAVar11->super_Node).firstSet = (CharSet<char16_t> *)0x0;
      (pAVar11->super_Node).followSet = (CharSet<char16_t> *)0x0;
      *(undefined8 *)&(pAVar11->super_Node).prevConsumes.upper = 0xffffffff;
      *(undefined8 *)&(pAVar11->super_Node).thisConsumes.upper = 0xffffffff;
      (pAVar11->super_Node).followConsumes.upper = 0xffffffff;
      (pAVar11->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01559190;
      pAVar11->head = pNVar9;
      pAVar11->tail = _uStack_50;
      pAVar11->runtimeTrie = (RuntimeCharTrie *)0x0;
      pAVar11->scheme = Try;
      pAVar11->isOptional = false;
      pAVar11->switchSize = 0;
      lastAltNode = pAStack_78;
    }
  }
  if (lastAltNode != (AltNode *)0x0) {
    if (lastAltNode->tail != (AltNode *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x219,"(lastAltNode->tail == nullptr)","lastAltNode->tail == nullptr");
      if (!bVar5) {
LAB_00ec7724:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    lastAltNode->tail = pAVar11;
  }
  return pAVar11;
}

Assistant:

AltNode* Parser<P, IsLiteral>::AppendSurrogateRangeToDisjunction(codepoint_t minorCodePoint, codepoint_t majorCodePoint, AltNode *lastAltNode)
    {
        Assert(minorCodePoint < majorCodePoint);
        Assert(minorCodePoint >= 0x10000u);
        Assert(majorCodePoint >= 0x10000u);
        Assert(scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled() && unicodeFlagPresent);

        char16 lowerMinorCodeUnit, upperMinorCodeUnit, lowerMajorCodeUnit, upperMajorCodeUnit;
        Js::NumberUtilities::CodePointAsSurrogatePair(minorCodePoint, &lowerMinorCodeUnit, &upperMinorCodeUnit);
        Js::NumberUtilities::CodePointAsSurrogatePair(majorCodePoint, &lowerMajorCodeUnit, &upperMajorCodeUnit);

        // These boundaries represent whole range boundaries, as in 0x10000, 0x10400, 0x10800 etc
        // minor boundary is the first boundary strictly above minorCodePoint
        // major boundary is the first boundary below or equal to majorCodePoint
        codepoint_t minorBoundary = minorCodePoint - (minorCodePoint % 0x400u) + 0x400u;
        codepoint_t majorBoundary = majorCodePoint - (majorCodePoint % 0x400u);

        Assert(minorBoundary >= 0x10000);
        Assert(majorBoundary >= 0x10000);

        AltNode* tailToAdd = nullptr;

        // If the minor boundary is higher than major boundary, that means we have a range within the boundary and is less than 0x400
        // Ex: 0x10430 - 0x10700 will have minor boundary of 0x10800 and major of 0x10400
        // This pair will be represented in single range set.
        const bool singleRange = minorBoundary > majorBoundary;
        if (singleRange)
        {
            Assert(majorCodePoint - minorCodePoint < 0x400u);
            Assert(lowerMinorCodeUnit == lowerMajorCodeUnit);

            MatchCharNode* lowerCharNode = Anew(ctAllocator, MatchCharNode, lowerMinorCodeUnit);
            MatchSetNode* setNode = Anew(ctAllocator, MatchSetNode, false, false);
            setNode->set.SetRange(ctAllocator, (Char)upperMinorCodeUnit, (Char)upperMajorCodeUnit);
            ConcatNode* concatNode = Anew(ctAllocator, ConcatNode, lowerCharNode, Anew(ctAllocator, ConcatNode, setNode, nullptr));

            tailToAdd = Anew(ctAllocator, AltNode, concatNode, nullptr);
        }
        else
        {
            Node* prefixNode = nullptr, *suffixNode = nullptr;
            const bool twoConsecutiveRanges = minorBoundary == majorBoundary;

            // For minorBoundary,
            if (minorBoundary - minorCodePoint == 1) // Single character in minor range
            {
                // The prefix is only a surrogate pair atom
                prefixNode = CreateSurrogatePairAtom(lowerMinorCodeUnit, upperMinorCodeUnit);
            }
            else if (minorCodePoint != minorBoundary - 0x400u) // Minor range isn't full
            {
                Assert(minorBoundary - minorCodePoint < 0x400u);
                MatchCharNode* lowerCharNode = Anew(ctAllocator, MatchCharNode, (Char)lowerMinorCodeUnit);
                MatchSetNode* upperSetNode = Anew(ctAllocator, MatchSetNode, false);
                upperSetNode->set.SetRange(ctAllocator, (Char)upperMinorCodeUnit, (Char)0xDFFFu);
                prefixNode = Anew(ctAllocator, ConcatNode, lowerCharNode, Anew(ctAllocator, ConcatNode, upperSetNode, nullptr));
            }
            else // Full minor range
            {
                minorBoundary -= 0x400u;
            }

            if (majorBoundary == majorCodePoint) // Single character in major range
            {
                // The suffix is only a surrogate pair atom
                suffixNode = CreateSurrogatePairAtom(lowerMajorCodeUnit, upperMajorCodeUnit);
                majorBoundary -= 0x400u;
            }
            else if (majorBoundary + 0x3FFu != majorCodePoint) // Major range isn't full
            {
                Assert(majorCodePoint - majorBoundary < 0x3FFu);
                MatchCharNode* lowerCharNode = Anew(ctAllocator, MatchCharNode, (Char)lowerMajorCodeUnit);
                MatchSetNode* upperSetNode = Anew(ctAllocator, MatchSetNode, false, false);
                upperSetNode->set.SetRange(ctAllocator, (Char)0xDC00u, (Char)upperMajorCodeUnit);
                suffixNode = Anew(ctAllocator, ConcatNode, lowerCharNode, Anew(ctAllocator, ConcatNode, upperSetNode, nullptr));
                majorBoundary -= 0x400u;
            }

            const bool nonFullConsecutiveRanges = twoConsecutiveRanges && prefixNode != nullptr && suffixNode != nullptr;
            if (nonFullConsecutiveRanges)
            {
                Assert(suffixNode != nullptr);
                Assert(minorCodePoint != minorBoundary - 0x400u);
                Assert(majorBoundary + 0x3FFu != majorCodePoint);

                // If the minor boundary is equal to major boundary, that means we have a cross boundary range that only needs 2 nodes for prefix/suffix.
                // We can only cross one boundary.
                Assert(majorCodePoint - minorCodePoint < 0x800u);
                tailToAdd = Anew(ctAllocator, AltNode, prefixNode, Anew(ctAllocator, AltNode, suffixNode, nullptr));
            }
            else
            {
                // We have 3 sets of ranges, comprising of prefix, full and suffix.
                Assert(majorCodePoint - minorCodePoint >= 0x400u);
                Assert((prefixNode != nullptr && suffixNode != nullptr) // Spanning more than two ranges
                    || (prefixNode == nullptr && minorBoundary == minorCodePoint) // Two consecutive ranges and the minor is full
                    || (suffixNode == nullptr && majorBoundary + 0x3FFu == majorCodePoint)); // Two consecutive ranges and the major is full

                Node* lowerOfFullRange;
                char16 lowerMinorBoundary, lowerMajorBoundary, ignore;
                Js::NumberUtilities::CodePointAsSurrogatePair(minorBoundary, &lowerMinorBoundary, &ignore);

                bool singleFullRange = majorBoundary == minorBoundary;
                if (singleFullRange)
                {
                    // The lower part of the full range is simple a surrogate lower char
                    lowerOfFullRange = Anew(ctAllocator, MatchCharNode, (Char)lowerMinorBoundary);
                }
                else
                {

                    Js::NumberUtilities::CodePointAsSurrogatePair(majorBoundary, &lowerMajorBoundary, &ignore);
                    MatchSetNode* setNode = Anew(ctAllocator, MatchSetNode, false, false);
                    setNode->set.SetRange(ctAllocator, (Char)lowerMinorBoundary, (Char)lowerMajorBoundary);
                    lowerOfFullRange = setNode;
                }
                MatchSetNode* fullUpperRange = Anew(ctAllocator, MatchSetNode, false, false);
                fullUpperRange->set.SetRange(ctAllocator, (Char)0xDC00u, (Char)0xDFFFu);

                // These are added in the following order [full] [prefix][suffix]
                // This is doing by prepending, so in reverse.
                if (suffixNode != nullptr)
                {
                    tailToAdd = Anew(ctAllocator, AltNode, suffixNode, tailToAdd);
                }
                if (prefixNode != nullptr)
                {
                    tailToAdd = Anew(ctAllocator, AltNode, prefixNode, tailToAdd);
                }
                tailToAdd = Anew(ctAllocator, AltNode, Anew(ctAllocator, ConcatNode, lowerOfFullRange, Anew(ctAllocator, ConcatNode, fullUpperRange, nullptr)), tailToAdd);
            }
        }

        if (lastAltNode != nullptr)
        {
            Assert(lastAltNode->tail == nullptr);
            lastAltNode->tail = tailToAdd;
        }

        return tailToAdd;
    }